

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

bool __thiscall QResourceFileEnginePrivate::mapUncompressed_sys(QResourceFileEnginePrivate *this)

{
  QResource *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  uchar *location;
  qint64 qVar5;
  void *__addr;
  char *pcVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  R_conflict3 local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->resource;
  local_48.offset = (qptrdiff)&DAT_aaaaaaaaaaaaaaaa;
  local_48.begin = &DAT_aaaaaaaaaaaaaaaa;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  location = QResource::data(this_00);
  qVar5 = QResource::uncompressedSize(this_00);
  mappingBoundaries(&local_48,location,qVar5);
  bVar3 = QResourcePrivate::mayRemapData(this_00);
  qVar1 = local_48.size;
  if (bVar3) {
    bVar3 = false;
    __addr = mremap(local_48.begin,local_48.size,local_48.size,5);
    if (__addr == (void *)0xffffffffffffffff) goto LAB_00238d8a;
    iVar4 = mprotect(__addr,qVar1,3);
    if (iVar4 == 0) {
      if (__addr != (void *)0x0) {
        pcVar6 = (char *)(local_48.offset + (long)__addr);
        qVar5 = QResource::uncompressedSize(this_00);
        QByteArray::fromRawData((QByteArray *)&local_68,pcVar6,qVar5);
        pDVar2 = (this->uncompressed).d.d;
        pcVar6 = (this->uncompressed).d.ptr;
        (this->uncompressed).d.d = local_68.d;
        (this->uncompressed).d.ptr = local_68.ptr;
        qVar1 = (this->uncompressed).d.size;
        (this->uncompressed).d.size = local_68.size;
        local_68.d = pDVar2;
        local_68.ptr = pcVar6;
        local_68.size = qVar1;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
        this->mustUnmap = true;
        bVar3 = true;
        goto LAB_00238d8a;
      }
    }
    else {
      munmap(__addr,qVar1);
    }
  }
  bVar3 = false;
LAB_00238d8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QResourceFileEnginePrivate::mapUncompressed_sys()
{
    auto r = mappingBoundaries(resource.data(), resource.uncompressedSize());
    void *ptr = nullptr;

#if defined(MREMAP_MAYMOVE) && defined(MREMAP_DONTUNMAP)
    // Use MREMAP_MAYMOVE to tell the kernel to give us a new address and use
    // MREMAP_DONTUNMAP (supported since kernel 5.7) to request that it create
    // a new mapping of the same pages, instead of moving. We can only do that
    // for pages that are read-only, otherwise the kernel replaces the source
    // with pages full of nulls.
    if (!QResourcePrivate::mayRemapData(resource))
        return false;

    ptr = mremap(r.begin, r.size, r.size, MREMAP_MAYMOVE | MREMAP_DONTUNMAP);
    if (ptr == MAP_FAILED)
        return false;

    // Allow writing, which the documentation says we allow. This is safe
    // because MREMAP_DONTUNMAP only works for private mappings.
    if (mprotect(ptr, r.size, PROT_READ | PROT_WRITE) != 0) {
        munmap(ptr, r.size);
        return false;
    }
#elif defined(Q_OS_DARWIN)
    mach_port_t self = mach_task_self();
    vm_address_t addr = 0;
    vm_address_t mask = 0;
    bool anywhere = true;
    bool copy = true;
    vm_prot_t cur_prot = VM_PROT_READ | VM_PROT_WRITE;
    vm_prot_t max_prot = VM_PROT_ALL;
    kern_return_t res = vm_remap(self, &addr, r.size, mask, anywhere,
                                 self, vm_address_t(r.begin), copy, &cur_prot,
                                 &max_prot, VM_INHERIT_DEFAULT);
    if (res != KERN_SUCCESS)
        return false;

    ptr = reinterpret_cast<void *>(addr);
    if ((max_prot & VM_PROT_WRITE) == 0 || mprotect(ptr, r.size, PROT_READ | PROT_WRITE) != 0) {
        munmap(ptr, r.size);
        return false;
    }
#endif

    if (!ptr)
        return false;
    const char *newdata = static_cast<char *>(ptr) + r.offset;
    uncompressed = QByteArray::fromRawData(newdata, resource.uncompressedSize());
    mustUnmap = true;
    return true;
}